

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O1

bool apngasm::spec::priv::anon_unknown_0::s2u(string *str,uint *pOut)

{
  bool bVar1;
  uint result;
  i_interpreter_type i_interpreter;
  uint local_3c;
  undefined **local_38;
  type_info_t *local_30;
  type_info_t *local_28;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_20;
  
  if (pOut == (uint *)0x0) {
    bVar1 = false;
  }
  else {
    local_3c = 0;
    local_30 = (type_info_t *)(str->_M_dataplus)._M_p;
    local_28 = local_30 + str->_M_string_length;
    local_20.start = (char *)local_30;
    local_20.finish = (char *)local_28;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_unsigned<unsigned_int>(&local_20,&local_3c);
    if (!bVar1) {
      local_38 = &PTR__bad_cast_00180458;
      local_30 = (type_info_t *)&std::__cxx11::string::typeinfo;
      local_28 = (type_info_t *)&unsigned_int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_38);
    }
    *pOut = local_3c;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool s2u(const std::string& str, unsigned int* pOut)
        {
          if(pOut == NULL)
            return false;

          try
          {
            *pOut = boost::lexical_cast<unsigned int>(str);
            return true;
          }
          catch(boost::bad_lexical_cast& e)
          {
            return false;
          }
        }